

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerRestify(Lowerer *this,Instr *newRestInstr)

{
  HelperCallOpnd *newSrc;
  Opnd *newSrc_00;
  Instr *pIVar1;
  
  newSrc = IR::HelperCallOpnd::New(HelperRestify,this->m_func);
  newSrc_00 = IR::Instr::UnlinkSrc1(newRestInstr);
  IR::Instr::SetSrc1(newRestInstr,&newSrc->super_Opnd);
  IR::Instr::SetSrc2(newRestInstr,newSrc_00);
  pIVar1 = LowererMD::LowerCallHelper(&this->m_lowererMD,newRestInstr);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerRestify(IR::Instr * newRestInstr)
{
    IR::HelperCallOpnd *helperOpnd = IR::HelperCallOpnd::New(IR::HelperRestify, this->m_func);

    IR::Opnd * src1 = newRestInstr->UnlinkSrc1();
    newRestInstr->SetSrc1(helperOpnd);
    newRestInstr->SetSrc2(src1);

    return m_lowererMD.LowerCallHelper(newRestInstr);
}